

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::moveFromDataSpace(Forth *this,string *dst,Cell src,size_t count)

{
  bool bVar1;
  Char CVar2;
  Char *pCVar3;
  char *c;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  size_t count_local;
  Cell src_local;
  string *dst_local;
  Forth *this_local;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize(dst,count)
  ;
  __end2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                     (dst);
  c = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                        (dst);
  count_local._4_4_ = src;
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      (&__end2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&c);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pCVar3 = (Char *)__gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end2);
    CVar2 = dataSpaceAt(this,count_local._4_4_);
    *pCVar3 = CVar2;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
    count_local._4_4_ = count_local._4_4_ + 1;
  }
  return;
}

Assistant:

void moveFromDataSpace(std::string &dst, Cell src, size_t count){
			dst.resize(count);
			for(auto &c : dst) c=dataSpaceAt(src++);
		}